

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O0

Dist * Omega_h::get_local_elem_uses2own_verts(Dist *__return_storage_ptr__,Mesh *mesh)

{
  void **__return_storage_ptr___00;
  Int to;
  LO nrroots;
  Remotes local_108;
  undefined1 local_e8 [64];
  undefined1 local_a8 [8];
  Remotes uses2own_verts;
  Remotes verts2own_verts;
  undefined1 local_58 [8];
  LOs verts2uses;
  Adj verts2elems;
  Mesh *mesh_local;
  
  to = Mesh::dim(mesh);
  __return_storage_ptr___00 = &verts2uses.write_.shared_alloc_.direct_ptr;
  Mesh::ask_up((Adj *)__return_storage_ptr___00,mesh,0,to);
  Read<int>::Read((Read<int> *)local_58,(Read<int> *)__return_storage_ptr___00);
  Mesh::ask_owners((Remotes *)&uses2own_verts.idxs.write_.shared_alloc_.direct_ptr,mesh,0);
  Remotes::Remotes((Remotes *)(local_e8 + 0x20),
                   (Remotes *)&uses2own_verts.idxs.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)(local_e8 + 0x10),(Read<int> *)local_58);
  expand((Remotes *)local_a8,(Remotes *)(local_e8 + 0x20),(LOs *)(local_e8 + 0x10));
  Read<int>::~Read((Read<int> *)(local_e8 + 0x10));
  Remotes::~Remotes((Remotes *)(local_e8 + 0x20));
  Mesh::comm((Mesh *)local_e8);
  Remotes::Remotes(&local_108,(Remotes *)local_a8);
  nrroots = Mesh::nverts(mesh);
  Dist::Dist(__return_storage_ptr__,(CommPtr *)local_e8,&local_108,nrroots);
  Remotes::~Remotes(&local_108);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_e8);
  Remotes::~Remotes((Remotes *)local_a8);
  Remotes::~Remotes((Remotes *)&uses2own_verts.idxs.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)local_58);
  Adj::~Adj((Adj *)&verts2uses.write_.shared_alloc_.direct_ptr);
  return __return_storage_ptr__;
}

Assistant:

Dist get_local_elem_uses2own_verts(Mesh* mesh) {
  auto verts2elems = mesh->ask_up(VERT, mesh->dim());
  auto verts2uses = verts2elems.a2ab;
  auto verts2own_verts = mesh->ask_owners(VERT);
  auto uses2own_verts = expand(verts2own_verts, verts2uses);
  return Dist(mesh->comm(), uses2own_verts, mesh->nverts());
}